

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

void mpc_undefine_unretained(mpc_parser_t *p,int force)

{
  void *__ptr;
  mpc_parser_t *p_00;
  mpc_ctor_t __ptr_00;
  int i;
  long lVar1;
  
  if ((force == 0) && (p->retained != '\0')) {
    return;
  }
  switch(p->type) {
  case '\x02':
  case '\n':
  case '\v':
  case '\x0e':
    __ptr_00 = (p->data).lift.lf;
    break;
  default:
    goto switchD_00102f71_caseD_3;
  case '\x05':
    mpc_undefine_unretained((p->data).expect.x,0);
    __ptr_00 = (mpc_ctor_t)(p->data).lift.x;
    break;
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
    p_00 = (p->data).expect.x;
    goto LAB_00102f83;
  case '\x14':
  case '\x15':
  case '\x16':
    p_00 = (p->data).repeat.x;
LAB_00102f83:
    mpc_undefine_unretained(p_00,0);
    goto switchD_00102f71_caseD_3;
  case '\x17':
    for (lVar1 = 0; __ptr_00 = (mpc_ctor_t)(p->data).lift.x, lVar1 < (p->data).repeat.n;
        lVar1 = lVar1 + 1) {
      mpc_undefine_unretained(*(mpc_parser_t **)(__ptr_00 + lVar1 * 8),0);
    }
    break;
  case '\x18':
    for (lVar1 = 0; __ptr = (p->data).apply_to.d, lVar1 < (p->data).repeat.n; lVar1 = lVar1 + 1) {
      mpc_undefine_unretained(*(mpc_parser_t **)((long)__ptr + lVar1 * 8),0);
    }
    free(__ptr);
    goto LAB_00102fcf;
  case '\x19':
    mpc_undefine_unretained((p->data).expect.x,0);
LAB_00102fcf:
    __ptr_00 = (mpc_ctor_t)(p->data).check_with.d;
    break;
  case '\x1a':
    mpc_undefine_unretained((p->data).expect.x,0);
    __ptr_00 = (mpc_ctor_t)(p->data).check_with.e;
  }
  free(__ptr_00);
switchD_00102f71_caseD_3:
  if (force != 0) {
    return;
  }
  free(p->name);
  free(p);
  return;
}

Assistant:

static void mpc_undefine_unretained(mpc_parser_t *p, int force) {

  if (p->retained && !force) { return; }

  switch (p->type) {

    case MPC_TYPE_FAIL: free(p->data.fail.m); break;

    case MPC_TYPE_ONEOF:
    case MPC_TYPE_NONEOF:
    case MPC_TYPE_STRING:
      free(p->data.string.x);
      break;

    case MPC_TYPE_APPLY:    mpc_undefine_unretained(p->data.apply.x, 0);    break;
    case MPC_TYPE_APPLY_TO: mpc_undefine_unretained(p->data.apply_to.x, 0); break;
    case MPC_TYPE_PREDICT:  mpc_undefine_unretained(p->data.predict.x, 0);  break;

    case MPC_TYPE_MAYBE:
    case MPC_TYPE_NOT:
      mpc_undefine_unretained(p->data.not.x, 0);
      break;

    case MPC_TYPE_EXPECT:
      mpc_undefine_unretained(p->data.expect.x, 0);
      free(p->data.expect.m);
      break;

    case MPC_TYPE_MANY:
    case MPC_TYPE_MANY1:
    case MPC_TYPE_COUNT:
      mpc_undefine_unretained(p->data.repeat.x, 0);
      break;

    case MPC_TYPE_OR:  mpc_undefine_or(p);  break;
    case MPC_TYPE_AND: mpc_undefine_and(p); break;

    case MPC_TYPE_CHECK:
      mpc_undefine_unretained(p->data.check.x, 0);
      free(p->data.check.e);
      break;

    case MPC_TYPE_CHECK_WITH:
      mpc_undefine_unretained(p->data.check_with.x, 0);
      free(p->data.check_with.e);
      break;

    default: break;
  }

  if (!force) {
    free(p->name);
    free(p);
  }

}